

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbytarr.cpp
# Opt level: O0

void __thiscall CVmObjByteArray::discard_undo(CVmObjByteArray *this,CVmUndoRecord *rec)

{
  long in_RSI;
  
  if (*(long *)(in_RSI + 8) != 0) {
    free(*(void **)(in_RSI + 8));
    *(undefined8 *)(in_RSI + 8) = 0;
  }
  return;
}

Assistant:

void CVmObjByteArray::discard_undo(VMG_ struct CVmUndoRecord *rec)
{
    /* delete our extra information record if present */
    if (rec->id.ptrval != 0)
    {
        /* free the record */
        t3free((bytearray_undo_rec *)rec->id.ptrval);

        /* clear the pointer so we know it's gone */
        rec->id.ptrval = 0;
    }
}